

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O0

void __thiscall shared_ptr_swap_ptr_Test::shared_ptr_swap_ptr_Test(shared_ptr_swap_ptr_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  shared_ptr_swap_ptr_Test *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__shared_ptr_swap_ptr_Test_00213968;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, swap_ptr)
{
    // Create a shared_ptr
    shared_ptr<Struct> xPtr(new Struct(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct::_mNbInstances);
    Struct* pX = xPtr.get();

    // Create another shared_ptr
    shared_ptr<Struct> yPtr(new Struct(234));

    EXPECT_EQ(true, yPtr);
    EXPECT_EQ(true, yPtr.unique());
    EXPECT_EQ(1, yPtr.use_count());
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    EXPECT_EQ(2, Struct::_mNbInstances);
    Struct* pY = yPtr.get();

    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        xPtr.swap(yPtr);
        EXPECT_GT(xPtr, yPtr);
        EXPECT_EQ(true, xPtr);
        EXPECT_EQ(true, yPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        xPtr.swap(yPtr);
        EXPECT_LT(xPtr, yPtr);
        EXPECT_EQ(true, xPtr);
        EXPECT_EQ(true, yPtr);
    }
}